

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  undefined8 *puVar1;
  pointer pcVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  _Alloc_hider _Var6;
  uint uVar7;
  snd_seq_event_t ev;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined2 uStack_ba;
  undefined4 uStack_b8;
  undefined8 uStack_b4;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uVar7 = (uint)size;
  if (*(uint *)(puVar1 + 4) < uVar7) {
    *(uint *)(puVar1 + 4) = uVar7;
    iVar3 = snd_midi_event_resize_buffer(puVar1[3]);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x110f9d);
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_80);
      local_a0.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
      _Var6._M_p = local_80._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return;
      }
      goto LAB_0010f1e3;
    }
    free((void *)puVar1[5]);
    pvVar4 = malloc((ulong)*(uint *)(puVar1 + 4));
    puVar1[5] = pvVar4;
    if (pvVar4 == (void *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x110d9c);
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_a0);
      _Var6._M_p = local_a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
        return;
      }
      goto LAB_0010f1e3;
    }
  }
  uStack_b8 = 0;
  uStack_b4 = 0;
  uStack_c0 = 0;
  uStack_bc = 0;
  uStack_bb = *(undefined1 *)((long)puVar1 + 0xc);
  uStack_ba = 0xfdfe;
  local_c8 = 0xfd000000;
  if (uVar7 != 0) {
    uVar5 = 0;
    do {
      *(uchar *)(puVar1[5] + uVar5) = message[uVar5];
      uVar5 = uVar5 + 1;
    } while ((size & 0xffffffff) != uVar5);
  }
  iVar3 = snd_midi_event_encode(puVar1[3],puVar1[5],size & 0xffffffff,&local_c8);
  if (iVar3 < (int)uVar7) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,0x110fde
              );
    pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,
               pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
    MidiApi::error((MidiApi *)this,WARNING,&local_40);
    local_a0.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    _Var6._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
  }
  else {
    iVar3 = snd_seq_event_output(*puVar1);
    if (-1 < iVar3) {
      snd_seq_drain_output(*puVar1);
      return;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,0x11100d
              );
    pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,
               pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
    MidiApi::error((MidiApi *)this,WARNING,&local_60);
    local_a0.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
    _Var6._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
LAB_0010f1e3:
  operator_delete(_Var6._M_p,local_a0.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  int result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  snd_seq_event_t ev;
  snd_seq_ev_clear( &ev );
  snd_seq_ev_set_source( &ev, data->vport );
  snd_seq_ev_set_subs( &ev );
  snd_seq_ev_set_direct( &ev );
  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];
  result = snd_midi_event_encode( data->coder, data->buffer, (long)nBytes, &ev );
  if ( result < (int)nBytes ) {
    errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  // Send the event.
  result = snd_seq_event_output( data->seq, &ev );
  if ( result < 0 ) {
    errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }
  snd_seq_drain_output( data->seq );
}